

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bt_peer_connection.cpp
# Opt level: O2

void __thiscall libtorrent::aux::bt_peer_connection::on_connected(bt_peer_connection *this)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  long lVar6;
  uint uVar7;
  cork c_;
  shared_ptr<libtorrent::aux::torrent> t;
  undefined4 extraout_var;
  
  iVar3 = (*(this->super_peer_connection).super_bandwidth_socket._vptr_bandwidth_socket[1])();
  if ((char)iVar3 != '\0') {
    return;
  }
  ::std::__weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>::__weak_ptr
            ((__weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2> *)&c_,
             &(this->super_peer_connection).super_peer_connection_hot_members.m_torrent.
              super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>);
  ::std::__shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&t.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>,
             (__weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2> *)&c_);
  ::std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
            ((__weak_count<(__gnu_cxx::_Lock_policy)2> *)&c_.m_need_uncork);
  if ((((t.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
       super_torrent_hot_members).field_0x4b & 0x80) != 0) {
    peer_connection::peer_log(&this->super_peer_connection,info,"ON_CONNECTED","graceful-paused");
    boost::system::error_code::error_code<libtorrent::errors::error_code_enum>
              ((error_code *)&c_,torrent_paused,(type *)0x0);
    (*(this->super_peer_connection).super_bandwidth_socket._vptr_bandwidth_socket[0x14])
              (this,(error_code *)&c_,1,0);
    goto LAB_001856fb;
  }
  bVar1 = (this->super_peer_connection).m_channel_state.
          super_array<libtorrent::flags::bitfield_flag<unsigned_char,_libtorrent::bandwidth_state_flags_tag,_void>,_2UL>
          ._M_elems[0].m_val;
  c_.m_need_uncork = (bVar1 & 4) == 0;
  if (c_.m_need_uncork) {
    (this->super_peer_connection).m_channel_state.
    super_array<libtorrent::flags::bitfield_flag<unsigned_char,_libtorrent::bandwidth_state_flags_tag,_void>,_2UL>
    ._M_elems[0].m_val = bVar1 | 4;
  }
  c_.m_pc = &this->super_peer_connection;
  uVar4 = session_settings::get_int
                    ((this->super_peer_connection).super_peer_connection_hot_members.m_settings,
                     0x4076);
  bVar2 = is_ssl(&(this->super_peer_connection).m_socket);
  uVar7 = 2;
  if (!bVar2) {
    uVar7 = uVar4 & 0xff;
  }
  uVar5 = 3;
  if (uVar7 < 3) {
    uVar5 = (ulong)uVar7;
  }
  peer_connection::peer_log
            (&this->super_peer_connection,info,"ENCRYPTION","outgoing encryption policy: %s",
             _ZZN10libtorrent3aux18bt_peer_connection12on_connectedEvE11policy_name_rel +
             *(int *)(_ZZN10libtorrent3aux18bt_peer_connection12on_connectedEvE11policy_name_rel +
                     uVar5 * 4));
  if (uVar7 == 0) {
    write_pe1_2_dhkey(this);
    iVar3 = (*(this->super_peer_connection).super_bandwidth_socket._vptr_bandwidth_socket[1])(this);
    if ((char)iVar3 == '\0') {
      (this->super_peer_connection).field_0x888 = 0;
      iVar3 = 0x60;
      goto LAB_00185693;
    }
  }
  else if (uVar7 == 1) {
    iVar3 = (*(this->super_peer_connection).super_bandwidth_socket._vptr_bandwidth_socket[7])(this);
    lVar6 = CONCAT44(extraout_var,iVar3);
    uVar7 = *(uint *)(lVar6 + 0x1b);
    if ((uVar7 >> 0x17 & 1) == 0) {
      *(uint *)(lVar6 + 0x1b) = uVar7 | 0x800000;
      write_handshake(this);
      iVar3 = 0x14;
    }
    else {
      *(uint *)(lVar6 + 0x1b) = uVar7 & 0xff7fffff;
      peer_connection::fast_reconnect(&this->super_peer_connection,true);
      write_pe1_2_dhkey(this);
      iVar3 = (*(this->super_peer_connection).super_bandwidth_socket._vptr_bandwidth_socket[1])
                        (this);
      if ((char)iVar3 != '\0') goto LAB_001856f1;
      (this->super_peer_connection).field_0x888 = 0;
      iVar3 = 0x60;
    }
    crypto_receive_buffer::reset(&this->m_recv_buffer,iVar3);
    peer_connection::setup_receive(&this->super_peer_connection);
  }
  else {
    write_handshake(this);
    iVar3 = 0x14;
LAB_00185693:
    crypto_receive_buffer::reset(&this->m_recv_buffer,iVar3);
    peer_connection::setup_receive(&this->super_peer_connection);
  }
LAB_001856f1:
  cork::~cork(&c_);
LAB_001856fb:
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&t.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            );
  return;
}

Assistant:

void bt_peer_connection::on_connected()
	{
		if (is_disconnecting()) return;

		auto t = associated_torrent().lock();
		TORRENT_ASSERT(t);

		if (t->graceful_pause())
		{
#ifndef TORRENT_DISABLE_LOGGING
			peer_log(peer_log_alert::info, "ON_CONNECTED", "graceful-paused");
#endif
			disconnect(errors::torrent_paused, operation_t::bittorrent);
			return;
		}

		// make sure are much as possible of the response ends up in the same
		// packet, or at least back-to-back packets
		cork c_(*this);

#if !defined TORRENT_DISABLE_ENCRYPTION

		auto out_policy = static_cast<std::uint8_t>(m_settings.get_int(settings_pack::out_enc_policy));

#ifdef TORRENT_SSL_PEERS
		// never try an encrypted connection when already using SSL
		if (is_ssl(get_socket()))
			out_policy = settings_pack::pe_disabled;
#endif
#if TORRENT_USE_RTC
		// never try an encrypted connection over WebRTC (which is already encrypted)
		if (torrent_peer *pi = peer_info_struct())
			if (pi->is_rtc_addr)
				out_policy = settings_pack::pe_disabled;
#endif
#ifndef TORRENT_DISABLE_LOGGING
		static char const* policy_name[] = {"forced", "enabled", "disabled", "invalid-setting"};
		int const policy_name_idx = out_policy > 3 ? 3 : out_policy;
		peer_log(peer_log_alert::info, "ENCRYPTION"
			, "outgoing encryption policy: %s", policy_name[policy_name_idx]);
#endif

		if (out_policy == settings_pack::pe_forced)
		{
			write_pe1_2_dhkey();
			if (is_disconnecting()) return;

			m_state = state_t::read_pe_dhkey;
			m_recv_buffer.reset(dh_key_len);
			setup_receive();
		}
		else if (out_policy == settings_pack::pe_enabled)
		{
			TORRENT_ASSERT(peer_info_struct());

			torrent_peer* pi = peer_info_struct();
			if (pi->pe_support == true)
			{
				// toggle encryption support flag, toggled back to
				// true if encrypted portion of the handshake
				// completes correctly
				pi->pe_support = false;

				// if this fails, we need to reconnect
				// fast.
				fast_reconnect(true);

				write_pe1_2_dhkey();
				if (is_disconnecting()) return;
				m_state = state_t::read_pe_dhkey;
				m_recv_buffer.reset(dh_key_len);
				setup_receive();
			}
			else // pi->pe_support == false
			{
				// toggled back to false if standard handshake
				// completes correctly (without encryption)
				pi->pe_support = true;

				write_handshake();
				m_recv_buffer.reset(20);
				setup_receive();
			}
		}
		else
#endif
		{
#if !defined TORRENT_DISABLE_ENCRYPTION
			TORRENT_ASSERT(out_policy == settings_pack::pe_disabled);
#endif
			write_handshake();

			TORRENT_ASSERT(m_sent_handshake);
			// start in the state where we are trying to read the
			// handshake from the other side
			m_recv_buffer.reset(20);
			setup_receive();
		}
	}